

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked-list.cpp
# Opt level: O3

void __thiscall LinkedList::control(LinkedList *this)

{
  bool bVar1;
  LinkedList *this_00;
  string prependPrompt;
  int stopLoop;
  int linkedListType;
  Node *head;
  long *local_e0;
  long local_d8;
  long local_d0 [2];
  int local_c0;
  int local_bc;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  Node *local_38;
  
  local_38 = (Node *)0x0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Enter 1 to prepend, 2 to append, 3 to delete, 4 to insert, and 5 to view list.",0x4e
              );
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    this_00 = (LinkedList *)&std::cin;
    std::istream::operator>>((istream *)&std::cin,&local_bc);
    switch(local_bc) {
    case 1:
      do {
        local_e0 = local_d0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e0,"Enter a number to prepend to linked list.","");
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_58,local_e0,local_d8 + (long)local_e0);
        bVar1 = handleActions(this,&local_58,&local_38,1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        if (local_e0 != local_d0) {
          operator_delete(local_e0,local_d0[0] + 1);
        }
      } while (bVar1);
      break;
    case 2:
      do {
        local_e0 = local_d0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e0,"Enter a number to append to linked list.","");
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_78,local_e0,local_d8 + (long)local_e0);
        bVar1 = handleActions(this,&local_78,&local_38,2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        if (local_e0 != local_d0) {
          operator_delete(local_e0,local_d0[0] + 1);
        }
      } while (bVar1);
      break;
    case 3:
      do {
        local_e0 = local_d0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e0,"Enter a number to delete from the linked list.","");
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,local_e0,local_d8 + (long)local_e0);
        bVar1 = handleActions(this,&local_98,&local_38,3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if (local_e0 != local_d0) {
          operator_delete(local_e0,local_d0[0] + 1);
        }
      } while (bVar1);
      break;
    case 4:
      do {
        local_e0 = local_d0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e0,"Enter a number to insert into the linked list.","");
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b8,local_e0,local_d8 + (long)local_e0);
        bVar1 = handleActions(this,&local_b8,&local_38,4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if (local_e0 != local_d0) {
          operator_delete(local_e0,local_d0[0] + 1);
        }
      } while (bVar1);
      break;
    case 5:
      printList(this_00,local_38);
      break;
    default:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Error occurred",0xe)
      ;
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
      std::ostream::put('X');
      std::ostream::flush();
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Enter 0 to continue manipulating the linked list or 1 to exit.",0x3e);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    std::istream::operator>>((istream *)&std::cin,&local_c0);
  } while (local_c0 == 0);
  return;
}

Assistant:

void LinkedList::control() {
	int linkedListType, stopLoop;

	// Head node
	Node* head = nullptr;

	while (true) {
		std::cout << "Enter 1 to prepend, 2 to append, 3 to delete, 4 to insert, and 5 to view list." << std::endl;
		std::cin >> linkedListType;

		// Prepend
		if (linkedListType == 1) {
			while (true) {
				std::string prependPrompt = "Enter a number to prepend to linked list.";
				
				if (handleActions(prependPrompt, &head, 1)) {
					continue;
				}
				else {
					break;
				}
			}
		}
		// Append
		else if (linkedListType == 2) {
			while (true) {
				std::string appendPrompt = "Enter a number to append to linked list.";
				
				if (handleActions(appendPrompt, &head, 2)) {
					continue;
				}
				else {
					break;
				}
			}
		}
		// Delete
		else if (linkedListType == 3) {
			while (true) {
				std::string deletionPrompt = "Enter a number to delete from the linked list.";
				
				if (handleActions(deletionPrompt, &head, 3)) {
					continue;
				}
				else {
					break;
				}
			}
		}
		// Insert
		else if (linkedListType == 4) {
			while (true) {
				std::string deletionPrompt = "Enter a number to insert into the linked list.";
				
				if (handleActions(deletionPrompt, &head, 4)) {
					continue;
				}
				else {
					break;
				}
			}
		}
		// View
		else if (linkedListType == 5) {
			printList(head);
		}
		// Exception
		else {
			std::cout << "Error occurred" << std::endl;
		}

		std::cout << "Enter 0 to continue manipulating the linked list or 1 to exit." << std::endl;
		std::cin >> stopLoop;

		if (stopLoop == 0) {
			continue;
		}
		else {
			break;
		}
	}
}